

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O3

void Diligent::ReserveSpaceForPipelineResourceSignatureDesc
               (FixedLinearAllocator *Allocator,PipelineResourceSignatureDesc *Desc)

{
  PipelineResourceDesc *pPVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  string msg;
  string local_50;
  
  FixedLinearAllocator::AddSpace(Allocator,(ulong)Desc->NumResources * 0x18,8);
  FixedLinearAllocator::AddSpace(Allocator,(ulong)Desc->NumImmutableSamplers * 0x48,8);
  if (Desc->NumResources != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pPVar1 = Desc->Resources;
      pcVar2 = *(char **)((long)&pPVar1->Name + lVar5);
      if (pcVar2 == (char *)0x0) {
        FormatString<char[97]>(&local_50,(char (*) [97])0x90bd55);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = *(char **)((long)&pPVar1->Name + lVar5);
      }
      if (*pcVar2 == '\0') {
        FormatString<char[98]>(&local_50,(char (*) [98])0x90bdc6);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1b9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(int *)((long)&pPVar1->ShaderStages + lVar5) == 0) {
        FormatString<char[120]>
                  (&local_50,
                   (char (*) [120])
                   "ShaderStages can\'t be SHADER_TYPE_UNKNOWN. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                  );
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1ba);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(int *)((long)&pPVar1->ArraySize + lVar5) == 0) {
        FormatString<char[99]>
                  (&local_50,
                   (char (*) [99])
                   "ArraySize can\'t be 0. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                  );
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1bb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      FixedLinearAllocator::AddSpaceForString(Allocator,*(Char **)((long)&pPVar1->Name + lVar5),0);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < Desc->NumResources);
  }
  if (Desc->NumImmutableSamplers != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pcVar2 = *(char **)((long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x24);
      if (pcVar2 == (char *)0x0) {
        FormatString<char[113]>
                  (&local_50,
                   (char (*) [113])
                   "SamplerOrTextureName can\'t be null. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                  );
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1c3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (*pcVar2 == '\0') {
        FormatString<char[114]>
                  (&local_50,
                   (char (*) [114])
                   "SamplerOrTextureName can\'t be empty. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                  );
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1c4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      sVar3 = strlen(pcVar2);
      FixedLinearAllocator::AddSpace(Allocator,sVar3 + 1,1);
      FixedLinearAllocator::AddSpaceForString
                (Allocator,
                 *(Char **)((long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x1c),0);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x48;
    } while (uVar4 < Desc->NumImmutableSamplers);
  }
  if (Desc->UseCombinedTextureSamplers != false) {
    FixedLinearAllocator::AddSpaceForString(Allocator,Desc->CombinedSamplerSuffix,0);
  }
  return;
}

Assistant:

void ReserveSpaceForPipelineResourceSignatureDesc(FixedLinearAllocator& Allocator, const PipelineResourceSignatureDesc& Desc)
{
    Allocator.AddSpace<PipelineResourceDesc>(Desc.NumResources);
    Allocator.AddSpace<ImmutableSamplerDesc>(Desc.NumImmutableSamplers);

    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];

        VERIFY(Res.Name != nullptr, "Name can't be null. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.Name[0] != '\0', "Name can't be empty. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.ShaderStages != SHADER_TYPE_UNKNOWN, "ShaderStages can't be SHADER_TYPE_UNKNOWN. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.ArraySize != 0, "ArraySize can't be 0. This error should've been caught by ValidatePipelineResourceSignatureDesc().");

        Allocator.AddSpaceForString(Res.Name);
    }

    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        const char* SamOrTexName = Desc.ImmutableSamplers[i].SamplerOrTextureName;
        VERIFY(SamOrTexName != nullptr, "SamplerOrTextureName can't be null. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(SamOrTexName[0] != '\0', "SamplerOrTextureName can't be empty. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        Allocator.AddSpaceForString(SamOrTexName);
        Allocator.AddSpaceForString(Desc.ImmutableSamplers[i].Desc.Name);
    }

    if (Desc.UseCombinedTextureSamplers)
        Allocator.AddSpaceForString(Desc.CombinedSamplerSuffix);
}